

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPointF __thiscall QGraphicsItem::mapToParent(QGraphicsItem *this,QPointF *point)

{
  QGraphicsItemPrivate *pQVar1;
  QPointF *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF *in_stack_ffffffffffffff70;
  QPointF local_68;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->extras);
  if (pQVar1->transformData == (TransformData *)0x0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RDI->extras);
    local_68 = ::operator+(in_RSI,in_stack_ffffffffffffff70);
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&in_RDI->extras);
    QGraphicsItemPrivate::transformToParent(in_RDI);
    local_68.xp = (qreal)QTransform::map((QPointF *)local_58);
    local_68.yp = in_XMM1_Qa;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapToParent(const QPointF &point) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return point + d_ptr->pos;
    return d_ptr->transformToParent().map(point);
}